

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsPixmapItem::setOffset(QGraphicsPixmapItem *this,QPointF *offset)

{
  QGraphicsItemPrivate *pQVar1;
  qreal qVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QRectF local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsItem).d_ptr.d;
  bVar3 = qFuzzyCompare((QPointF *)&pQVar1[1].childrenBoundingRect,offset);
  if (!bVar3) {
    QGraphicsItem::prepareGeometryChange(&this->super_QGraphicsItem);
    qVar2 = offset->yp;
    pQVar1[1].childrenBoundingRect.xp = offset->xp;
    pQVar1[1].childrenBoundingRect.yp = qVar2;
    *(undefined1 *)&pQVar1[1].needsRepaint.xp = 0;
    local_48.w = 0.0;
    local_48.h = 0.0;
    local_48.xp = 0.0;
    local_48.yp = 0.0;
    QGraphicsItem::update(&this->super_QGraphicsItem,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsPixmapItem::setOffset(const QPointF &offset)
{
    Q_D(QGraphicsPixmapItem);
    if (d->offset == offset)
        return;
    prepareGeometryChange();
    d->offset = offset;
    d->hasShape = false;
    update();
}